

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<capnp::LocalRequest> __thiscall
kj::
heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,kj::Own<capnp::LocalClient>>
          (kj *this,unsigned_long *params,unsigned_short *params_1,
          Maybe<capnp::MessageSize> *params_2,Own<capnp::LocalClient> *params_3)

{
  unsigned_short uVar1;
  unsigned_long uVar2;
  undefined8 *puVar3;
  LocalClient *pLVar4;
  Own<capnp::MallocMessageBuilder> OVar5;
  Own<capnp::LocalRequest> OVar6;
  Disposer *local_40;
  uint local_34;
  
  puVar3 = (undefined8 *)operator_new(0x38);
  uVar2 = *params;
  uVar1 = *params_1;
  if ((params_2->ptr).isSet == false) {
    local_40 = params_3->disposer;
    pLVar4 = params_3->ptr;
    params_3->ptr = (LocalClient *)0x0;
    local_34 = 0x400;
  }
  else {
    local_34 = *(uint *)&(params_2->ptr).field_1;
    local_40 = params_3->disposer;
    pLVar4 = params_3->ptr;
    params_3->ptr = (LocalClient *)0x0;
  }
  *puVar3 = &PTR_send_0061e978;
  OVar5 = heap<capnp::MallocMessageBuilder,unsigned_int>((kj *)(puVar3 + 1),&local_34);
  OVar6.ptr = OVar5.ptr;
  puVar3[3] = uVar2;
  *(unsigned_short *)(puVar3 + 4) = uVar1;
  puVar3[5] = local_40;
  puVar3[6] = pLVar4;
  *(undefined8 **)this = &_::HeapDisposer<capnp::LocalRequest>::instance;
  *(undefined8 **)(this + 8) = puVar3;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}